

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1214cb::Diff::Diff(Diff *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Diff_0026c070;
  in_memory_store::in_memory_store(&this->store_);
  pstore::database::database<pstore::file::in_memory>(&this->db_,&(this->store_).file_,true);
  (this->db_).vacuum_mode_ = disabled;
  return;
}

Assistant:

Diff::Diff ()
            : db_{store_.file ()} {
        db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    }